

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void __thiscall cubeb_async_logger::cubeb_async_logger(cubeb_async_logger *this)

{
  cubeb_async_logger *in_RDI;
  int in_stack_0000001c;
  ring_buffer_base<cubeb_log_message> *in_stack_00000020;
  
  (in_RDI->sleep_for).tv_sec = 0;
  (in_RDI->sleep_for).tv_nsec = 10000000;
  ring_buffer_base<cubeb_log_message>::ring_buffer_base(in_stack_00000020,in_stack_0000001c);
  run(in_RDI);
  return;
}

Assistant:

cubeb_async_logger() : msg_queue(CUBEB_LOG_MESSAGE_QUEUE_DEPTH) { run(); }